

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O2

void pfd_receive(Plug *plug,int urgent,char *data,size_t len)

{
  BinarySink *pBVar1;
  char cVar2;
  _func_void_Plug_ptr_PlugCloseType_char_ptr *p_Var3;
  SshChannel *pSVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uint uVar9;
  uint8_t *p;
  char *pcVar10;
  unsigned_long uVar11;
  PlugVtable *pPVar12;
  ushort *puVar13;
  strbuf *psVar14;
  size_t sVar15;
  uint uVar16;
  undefined4 uVar17;
  ptrlen pVar18;
  BinarySource src [1];
  
  if (len == 0) {
    return;
  }
  if (*(int *)((long)&plug[-5].vt + 4) != 0) {
    BinarySink_put_data((BinarySink *)&(plug[-2].vt)->sent,data,len);
    pPVar12 = plug[-2].vt;
    p_Var3 = pPVar12->closing;
    if (*(int *)((long)&plug[-5].vt + 4) == 1) {
      cVar2 = (char)*p_Var3;
      if (cVar2 == '\x04') {
        uVar17 = 2;
      }
      else {
        if (cVar2 != '\x05') {
LAB_0011f7b7:
          pfd_close((PortForwarding *)(plug + -8));
          return;
        }
        uVar17 = 3;
      }
      *(undefined4 *)((long)&plug[-5].vt + 4) = uVar17;
    }
    src[0].len = (size_t)pPVar12->receive;
    src[0].binarysource_ = src;
    src[0].pos = 0;
    src[0].err = BSE_NO_ERROR;
    src[0].data = p_Var3;
    BinarySource_get_data(src[0].binarysource_,(size_t)plug[-1].vt);
    uVar17 = *(undefined4 *)((long)&plug[-5].vt + 4);
switchD_0011f39e_default:
    switch(uVar17) {
    case 0:
      goto switchD_0011f39e_caseD_0;
    case 1:
      __assert_fail("false && \"These case values cannot appear\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/portfwd.c"
                    ,0xf5,"void pfd_receive(Plug *, int, const char *, size_t)");
    case 2:
      uVar8 = BinarySource_get_byte(src[0].binarysource_);
      uVar5 = BinarySource_get_byte(src[0].binarysource_);
      if ((src[0].binarysource_)->err == BSE_OUT_OF_DATA) {
        return;
      }
      if ((uVar8 == '\x04') && (uVar5 == '\x01')) {
        uVar9 = BinarySource_get_uint16(src[0].binarysource_);
        uVar11 = BinarySource_get_uint32(src[0].binarysource_);
        uVar16 = (uint)uVar11 - 1;
        BinarySource_get_asciz(src[0].binarysource_);
        if (uVar16 < 0xff) {
          pcVar10 = BinarySource_get_asciz(src[0].binarysource_);
        }
        else {
          pcVar10 = (char *)0x0;
        }
        if ((src[0].binarysource_)->err == BSE_NO_ERROR) {
          *(uint *)&plug[-3].vt = uVar9;
          if (uVar16 < 0xff) {
            pPVar12 = (PlugVtable *)dupstr(pcVar10);
          }
          else {
            pPVar12 = (PlugVtable *)ipv4_to_string((uint)uVar11);
          }
          plug[-4].vt = pPVar12;
          psVar14 = strbuf_new();
          pBVar1 = psVar14->binarysink_;
          uVar17 = 0;
          BinarySink_put_byte(pBVar1,'\0');
          BinarySink_put_byte(pBVar1,'Z');
          BinarySink_put_uint16(pBVar1,0);
          BinarySink_put_uint32(pBVar1,0);
          (**(code **)((plug[-6].vt)->log + 0x10))(plug[-6].vt,psVar14->u,psVar14->len);
          strbuf_free(psVar14);
          break;
        }
        if ((src[0].binarysource_)->err == BSE_OUT_OF_DATA) {
          return;
        }
      }
      psVar14 = strbuf_new();
      pBVar1 = psVar14->binarysink_;
      BinarySink_put_byte(pBVar1,'\0');
      BinarySink_put_byte(pBVar1,'[');
      BinarySink_put_uint16(pBVar1,0);
      BinarySink_put_uint32(pBVar1,0);
      (**(code **)((plug[-6].vt)->log + 0x10))(plug[-6].vt,psVar14->u,psVar14->len);
      strbuf_free(psVar14);
      goto LAB_0011f7b7;
    case 3:
      BinarySource_get_byte(src[0].binarysource_);
      pVar18 = BinarySource_get_pstring(src[0].binarysource_);
      sVar15 = 0;
      do {
        if (pVar18.len == sVar15) {
          uVar8 = 0xff;
          goto LAB_0011f4c5;
        }
        pcVar10 = (char *)((long)pVar18.ptr + sVar15);
        sVar15 = sVar15 + 1;
      } while (*pcVar10 != '\0');
      uVar8 = '\0';
LAB_0011f4c5:
      if ((src[0].binarysource_)->err != BSE_NO_ERROR) {
        if ((src[0].binarysource_)->err == BSE_OUT_OF_DATA) {
          return;
        }
        uVar8 = 0xff;
      }
      psVar14 = strbuf_new();
      BinarySink_put_byte(psVar14->binarysink_,'\x05');
      BinarySink_put_byte(psVar14->binarysink_,uVar8);
      (**(code **)((plug[-6].vt)->log + 0x10))(plug[-6].vt,psVar14->u,psVar14->len);
      strbuf_free(psVar14);
      uVar17 = 4;
      if (uVar8 == 0xff) goto LAB_0011f7b7;
      break;
    case 4:
      uVar5 = BinarySource_get_byte(src[0].binarysource_);
      uVar6 = BinarySource_get_byte(src[0].binarysource_);
      uVar7 = BinarySource_get_byte(src[0].binarysource_);
      uVar8 = '\a';
      if (((uVar5 == '\x05') && (uVar6 == '\x01')) && (uVar7 == '\0')) {
        uVar8 = BinarySource_get_byte(src[0].binarysource_);
        if (uVar8 == '\x04') {
          pVar18 = BinarySource_get_data(src[0].binarysource_,0x10);
          puVar13 = (ushort *)pVar18.ptr;
          if (pVar18.len != 0x10) {
            __assert_fail("ipv6.len == 16",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/portfwd.c"
                          ,0xb6,"char *ipv6_to_string(ptrlen)");
          }
          uVar8 = '\0';
          pPVar12 = (PlugVtable *)
                    dupprintf("%04x:%04x:%04x:%04x:%04x:%04x:%04x:%04x",
                              (ulong)(ushort)(*puVar13 << 8 | *puVar13 >> 8),
                              (ulong)(ushort)(puVar13[1] << 8 | puVar13[1] >> 8),
                              (ulong)(ushort)(puVar13[2] << 8 | puVar13[2] >> 8),
                              (ulong)(ushort)(puVar13[3] << 8 | puVar13[3] >> 8),
                              (ulong)(ushort)(puVar13[4] << 8 | puVar13[4] >> 8),
                              (ulong)(ushort)(puVar13[5] << 8 | puVar13[5] >> 8),
                              (ulong)(ushort)(puVar13[6] << 8 | puVar13[6] >> 8),
                              (ulong)(ushort)(puVar13[7] << 8 | puVar13[7] >> 8));
        }
        else {
          if (uVar8 == '\x03') {
            pVar18 = BinarySource_get_pstring(src[0].binarysource_);
            pPVar12 = (PlugVtable *)mkstr(pVar18);
          }
          else {
            if (uVar8 != '\x01') {
              pPVar12 = (PlugVtable *)0x0;
              uVar8 = '\b';
              goto LAB_0011f66e;
            }
            uVar11 = BinarySource_get_uint32(src[0].binarysource_);
            pPVar12 = (PlugVtable *)ipv4_to_string((uint)uVar11);
          }
          uVar8 = '\0';
        }
LAB_0011f66e:
        plug[-4].vt = pPVar12;
        uVar9 = BinarySource_get_uint16(src[0].binarysource_);
        *(uint *)&plug[-3].vt = uVar9;
      }
      if ((src[0].binarysource_)->err != BSE_NO_ERROR) {
        if ((src[0].binarysource_)->err == BSE_OUT_OF_DATA) {
          return;
        }
        uVar8 = '\x01';
      }
      psVar14 = strbuf_new();
      pBVar1 = psVar14->binarysink_;
      BinarySink_put_byte(pBVar1,'\x05');
      BinarySink_put_byte(pBVar1,uVar8);
      uVar17 = 0;
      BinarySink_put_byte(pBVar1,'\0');
      BinarySink_put_byte(pBVar1,'\x01');
      BinarySink_put_uint32(pBVar1,0);
      BinarySink_put_uint16(pBVar1,0);
      (**(code **)((plug[-6].vt)->log + 0x10))(plug[-6].vt,psVar14->u,psVar14->len);
      strbuf_free(psVar14);
      if (uVar8 != '\0') goto LAB_0011f7b7;
      break;
    default:
      goto switchD_0011f39e_default;
    }
    *(undefined4 *)((long)&plug[-5].vt + 4) = uVar17;
    plug[-1].vt = (PlugVtable *)src[0].pos;
    goto switchD_0011f39e_default;
  }
LAB_0011f74d:
  if (*(char *)((long)&plug[-5].vt + 1) == '\x01') {
    pSVar4 = ((PortForwarding *)(plug + -8))->c;
    (*pSVar4->vt->write)(pSVar4,false,data,len);
  }
  return;
switchD_0011f39e_caseD_0:
  (**(code **)((plug[-6].vt)->log + 0x28))(plug[-6].vt,1);
  pPVar12 = (PlugVtable *)
            wrap_lportfwd_open((ConnectionLayer *)plug[-7].vt,(char *)plug[-4].vt,
                               *(int *)&plug[-3].vt,(Socket *)plug[-6].vt,(Channel *)(plug + 1));
  plug[-8].vt = pPVar12;
  goto LAB_0011f74d;
}

Assistant:

static void pfd_receive(Plug *plug, int urgent, const char *data, size_t len)
{
    struct PortForwarding *pf =
        container_of(plug, struct PortForwarding, plug);

    if (len == 0)
        return;

    if (pf->socks_state != SOCKS_NONE) {
        BinarySource src[1];

        /*
         * Store all the data we've got in socksbuf.
         */
        put_data(pf->socksbuf, data, len);

        /*
         * Check the start of socksbuf to see if it's a valid and
         * complete message in the SOCKS exchange.
         */

        if (pf->socks_state == SOCKS_INITIAL) {
            /* Preliminary: check the first byte of the data (which we
             * _must_ have by now) to find out which SOCKS major
             * version we're speaking. */
            switch (pf->socksbuf->u[0]) {
              case SOCKS4_REQUEST_VERSION:
                pf->socks_state = SOCKS_4;
                break;
              case SOCKS5_REQUEST_VERSION:
                pf->socks_state = SOCKS_5_INITIAL;
                break;
              default:
                pfd_close(pf);         /* unrecognised version */
                return;
            }
        }

        BinarySource_BARE_INIT(src, pf->socksbuf->u, pf->socksbuf->len);
        get_data(src, pf->socksbuf_consumed);

        while (pf->socks_state != SOCKS_NONE) {
            unsigned socks_version, message_type, reserved_byte;
            unsigned reply_code, port, ipv4, method;
            ptrlen methods;
            const char *socks4_hostname;
            strbuf *output;

            switch (pf->socks_state) {
              case SOCKS_INITIAL:
              case SOCKS_NONE:
                unreachable("These case values cannot appear");

              case SOCKS_4:
                /* SOCKS 4/4A connect message */
                socks_version = get_byte(src);
                message_type = get_byte(src);

                if (get_err(src) == BSE_OUT_OF_DATA)
                    return;
                if (socks_version == SOCKS4_REQUEST_VERSION &&
                    message_type == SOCKS_CMD_CONNECT) {
                    /* CONNECT message */
                    bool name_based = false;

                    port = get_uint16(src);
                    ipv4 = get_uint32(src);
                    if (ipv4 >= SOCKS4A_NAME_FOLLOWS_BASE &&
                        ipv4 < SOCKS4A_NAME_FOLLOWS_LIMIT) {
                        /*
                         * Addresses in this range indicate the SOCKS 4A
                         * extension to specify a hostname, which comes
                         * after the username.
                         */
                        name_based = true;
                    }
                    get_asciz(src);        /* skip username */
                    socks4_hostname = name_based ? get_asciz(src) : NULL;

                    if (get_err(src) == BSE_OUT_OF_DATA)
                        return;
                    if (get_err(src))
                        goto socks4_reject;

                    pf->port = port;
                    if (name_based) {
                        pf->hostname = dupstr(socks4_hostname);
                    } else {
                        pf->hostname = ipv4_to_string(ipv4);
                    }

                    output = strbuf_new();
                    put_byte(output, SOCKS4_REPLY_VERSION);
                    put_byte(output, SOCKS4_RESP_SUCCESS);
                    put_uint16(output, 0);     /* null port field */
                    put_uint32(output, 0);     /* null address field */
                    sk_write(pf->s, output->u, output->len);
                    strbuf_free(output);

                    pf->socks_state = SOCKS_NONE;
                    pf->socksbuf_consumed = src->pos;
                    break;
                }

              socks4_reject:
                output = strbuf_new();
                put_byte(output, SOCKS4_REPLY_VERSION);
                put_byte(output, SOCKS4_RESP_FAILURE);
                put_uint16(output, 0);     /* null port field */
                put_uint32(output, 0);     /* null address field */
                sk_write(pf->s, output->u, output->len);
                strbuf_free(output);
                pfd_close(pf);
                return;

              case SOCKS_5_INITIAL:
                /* SOCKS 5 initial method list */
                socks_version = get_byte(src);
                methods = get_pstring(src);

                method = SOCKS5_AUTH_REJECTED;

                /* Search the method list for AUTH_NONE, which is the
                 * only one this client code can speak */
                for (size_t i = 0; i < methods.len; i++) {
                    unsigned char this_method =
                        ((const unsigned char *)methods.ptr)[i];
                    if (this_method == SOCKS5_AUTH_NONE) {
                        method = this_method;
                        break;
                    }
                }

                if (get_err(src) == BSE_OUT_OF_DATA)
                    return;
                if (get_err(src))
                    method = SOCKS5_AUTH_REJECTED;

                output = strbuf_new();
                put_byte(output, SOCKS5_REPLY_VERSION);
                put_byte(output, method);
                sk_write(pf->s, output->u, output->len);
                strbuf_free(output);

                if (method == SOCKS5_AUTH_REJECTED) {
                    pfd_close(pf);
                    return;
                }

                pf->socks_state = SOCKS_5_CONNECT;
                pf->socksbuf_consumed = src->pos;
                break;

              case SOCKS_5_CONNECT:
                /* SOCKS 5 connect message */
                socks_version = get_byte(src);
                message_type = get_byte(src);
                reserved_byte = get_byte(src);

                if (socks_version == SOCKS5_REQUEST_VERSION &&
                    message_type == SOCKS_CMD_CONNECT &&
                    reserved_byte == 0) {

                    reply_code = SOCKS5_RESP_SUCCESS;

                    switch (get_byte(src)) {
                      case SOCKS5_ADDR_IPV4:
                        pf->hostname = ipv4_to_string(get_uint32(src));
                        break;
                      case SOCKS5_ADDR_IPV6:
                        pf->hostname = ipv6_to_string(get_data(src, 16));
                        break;
                      case SOCKS5_ADDR_HOSTNAME:
                        pf->hostname = mkstr(get_pstring(src));
                        break;
                      default:
                        pf->hostname = NULL;
                        reply_code = SOCKS5_RESP_ADDRTYPE_NOT_SUPPORTED;
                        break;
                    }

                    pf->port = get_uint16(src);
                } else {
                    reply_code = SOCKS5_RESP_COMMAND_NOT_SUPPORTED;
                }

                if (get_err(src) == BSE_OUT_OF_DATA)
                    return;
                if (get_err(src))
                    reply_code = SOCKS5_RESP_FAILURE;

                output = strbuf_new();
                put_byte(output, SOCKS5_REPLY_VERSION);
                put_byte(output, reply_code);
                put_byte(output, 0);       /* reserved */
                put_byte(output, SOCKS5_ADDR_IPV4); /* IPv4 address follows */
                put_uint32(output, 0);     /* bound IPv4 address (unused) */
                put_uint16(output, 0);     /* bound port number (unused) */
                sk_write(pf->s, output->u, output->len);
                strbuf_free(output);

                if (reply_code != SOCKS5_RESP_SUCCESS) {
                    pfd_close(pf);
                    return;
                }

                pf->socks_state = SOCKS_NONE;
                pf->socksbuf_consumed = src->pos;
                break;
            }
        }

        /*
         * We come here when we're ready to make an actual
         * connection.
         */

        /*
         * Freeze the socket until the SSH server confirms the
         * connection.
         */
        sk_set_frozen(pf->s, true);

        pf->c = wrap_lportfwd_open(pf->cl, pf->hostname, pf->port, pf->s,
                                   &pf->chan);
    }
    if (pf->ready)
        sshfwd_write(pf->c, data, len);
}